

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<unsigned_int,int>::
Flush<duckdb::BitpackingCompressionState<unsigned_int,true,int>::BitpackingWriter>
          (BitpackingState<unsigned_int,int> *this)

{
  byte width;
  byte bVar1;
  bitpacking_width_t width_00;
  idx_t iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (*(idx_t *)(this + 0x4810) != 0) {
    if (((this[0x4845] == (BitpackingState<unsigned_int,int>)0x0) &&
        (*(int *)(this + 0x482c) != *(int *)(this + 0x4828))) ||
       (1 < (byte)((char)this[0x4848] - 1U))) {
      BitpackingState<unsigned_int,_int>::CalculateFORStats
                ((BitpackingState<unsigned_int,_int> *)this);
      BitpackingState<unsigned_int,_int>::CalculateDeltaStats
                ((BitpackingState<unsigned_int,_int> *)this);
      if (this[0x4846] == (BitpackingState<unsigned_int,int>)0x1) {
        if ((*(int *)(this + 0x4838) == *(int *)(this + 0x4834)) &&
           (((byte)this[0x4848] & 0xfe) != 4)) {
          BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstantDelta
                    (*(int *)(this + 0x4838),**(uint **)(this + 0x2008),*(idx_t *)(this + 0x4810),
                     *(uint **)(this + 0x2008),(bool *)(this + 0x4010),*(void **)(this + 0x4820));
          *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0xc;
          return true;
        }
        width = BitpackingPrimitives::MinimumBitWidth<unsigned_int,false>(*(uint *)(this + 0x483c));
        bVar1 = BitpackingPrimitives::MinimumBitWidth<unsigned_int,false>(*(uint *)(this + 0x4830));
        if ((width < bVar1) && (this[0x4848] != (BitpackingState<unsigned_int,int>)0x5)) {
          BitpackingState<unsigned_int,_int>::SubtractFrameOfReference<int>
                    ((BitpackingState<unsigned_int,_int> *)this,(int *)(this + 0x2010),
                     *(int *)(this + 0x4834));
          BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteDeltaFor
                    ((uint *)(this + 0x2010),(bool *)(this + 0x4010),width,*(uint *)(this + 0x4834),
                     *(int *)(this + 0x4840),*(uint **)(this + 0x2008),*(idx_t *)(this + 0x4810),
                     *(void **)(this + 0x4820));
          *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0x10;
          iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x4810),width);
          *(idx_t *)(this + 0x4818) = *(long *)(this + 0x4818) + iVar2;
          return true;
        }
      }
      if (this[0x4847] == (BitpackingState<unsigned_int,int>)0x1) {
        width_00 = BitpackingPrimitives::MinimumBitWidth<unsigned_int,false>
                             (*(uint *)(this + 0x4830));
        BitpackingState<unsigned_int,_int>::SubtractFrameOfReference<unsigned_int>
                  ((BitpackingState<unsigned_int,_int> *)this,*(uint **)(this + 0x2008),
                   *(uint *)(this + 0x4828));
        BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteFor
                  (*(uint **)(this + 0x2008),(bool *)(this + 0x4010),width_00,
                   *(uint *)(this + 0x4828),*(idx_t *)(this + 0x4810),*(void **)(this + 0x4820));
        iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x4810),width_00);
        *(idx_t *)(this + 0x4818) = iVar2 + *(long *)(this + 0x4818) + 0xc;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstant
                (*(uint *)(this + 0x482c),*(idx_t *)(this + 0x4810),*(void **)(this + 0x4820),
                 (bool)this[0x4845]);
      *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 8;
    }
  }
  return bVar3;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}